

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O0

vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *
deqp::gles31::Functional::anon_unknown_0::getCubeLevelAccesses
          (vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
           *__return_storage_ptr__,
          vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
          *data,ImageInfo *info,int faceNdx)

{
  deUint32 dVar1;
  int iVar2;
  int iVar3;
  int depth;
  IVec3 *v;
  size_type sVar4;
  const_reference this;
  uchar *data_00;
  ConstPixelBufferAccess local_a8;
  int local_80;
  int local_7c;
  int levelSize;
  int levelTexelBlockCount;
  IVec3 levelTexelBlockSize;
  undefined1 local_5c [8];
  IVec3 levelPixelSize;
  int level;
  IVec3 texelBlockPixelSize;
  int texelBlockSize;
  IVec3 size;
  TextureFormat format;
  int faceNdx_local;
  ImageInfo *info_local;
  vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  *data_local;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *result;
  
  dVar1 = ImageInfo::getFormat(info);
  size.m_data._4_8_ = glu::mapGLInternalFormat(dVar1);
  v = ImageInfo::getSize(info);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(texelBlockPixelSize.m_data + 2),v);
  dVar1 = ImageInfo::getFormat(info);
  texelBlockPixelSize.m_data[1] = getTexelBlockSize(dVar1);
  dVar1 = ImageInfo::getFormat(info);
  getTexelBlockPixelSize((anon_unknown_0 *)&level,dVar1);
  levelPixelSize.m_data[2]._3_1_ = 0;
  std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::vector
            (__return_storage_ptr__);
  for (levelPixelSize.m_data[1] = 0; iVar2 = levelPixelSize.m_data[1],
      sVar4 = std::
              vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
              ::size(data), iVar2 < (int)sVar4;
      levelPixelSize.m_data[1] = levelPixelSize.m_data[1] + 1) {
    dVar1 = ImageInfo::getTarget(info);
    getLevelSize((anon_unknown_0 *)local_5c,dVar1,(IVec3 *)(texelBlockPixelSize.m_data + 2),
                 levelPixelSize.m_data[1]);
    divRoundUp((anon_unknown_0 *)&levelSize,(IVec3 *)local_5c,(IVec3 *)&level);
    iVar2 = tcu::Vector<int,_3>::x((Vector<int,_3> *)&levelSize);
    iVar3 = tcu::Vector<int,_3>::y((Vector<int,_3> *)&levelSize);
    local_7c = tcu::Vector<int,_3>::z((Vector<int,_3> *)&levelSize);
    local_7c = iVar2 * iVar3 * local_7c;
    local_80 = local_7c * texelBlockPixelSize.m_data[1];
    iVar2 = tcu::Vector<int,_3>::x((Vector<int,_3> *)local_5c);
    iVar3 = tcu::Vector<int,_3>::y((Vector<int,_3> *)local_5c);
    depth = tcu::Vector<int,_3>::z((Vector<int,_3> *)local_5c);
    this = std::
           vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
           ::operator[](data,(long)levelPixelSize.m_data[1]);
    data_00 = de::ArrayBuffer<unsigned_char,_1UL,_1UL>::getElementPtr
                        (this,(long)(local_80 * faceNdx));
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
              (&local_a8,(TextureFormat *)(size.m_data + 1),iVar2,iVar3,depth,data_00);
    std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
    push_back(__return_storage_ptr__,&local_a8);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<tcu::ConstPixelBufferAccess> getCubeLevelAccesses (const vector<ArrayBuffer<deUint8> >&	data,
														  const ImageInfo&						info,
														  int									faceNdx)
{
	const tcu::TextureFormat			format				= glu::mapGLInternalFormat(info.getFormat());
	const IVec3							size				= info.getSize();
	const int							texelBlockSize		= getTexelBlockSize(info.getFormat());
	const IVec3							texelBlockPixelSize = getTexelBlockPixelSize(info.getFormat());
	vector<tcu::ConstPixelBufferAccess>	result;

	DE_ASSERT(info.getTarget() == GL_TEXTURE_CUBE_MAP);
	DE_ASSERT((int)data.size() == getLevelCount(info));

	for (int level = 0; level < (int)data.size(); level++)
	{
		const IVec3 levelPixelSize			= getLevelSize(info.getTarget(), size, level);
		const IVec3	levelTexelBlockSize		= divRoundUp(levelPixelSize, texelBlockPixelSize);
		const int	levelTexelBlockCount	= levelTexelBlockSize.x() * levelTexelBlockSize.y() * levelTexelBlockSize.z();
		const int	levelSize				= levelTexelBlockCount * texelBlockSize;

		result.push_back(tcu::ConstPixelBufferAccess(format, levelPixelSize.x(), levelPixelSize.y(), levelPixelSize.z(), data[level].getElementPtr(levelSize * faceNdx)));
	}

	return result;
}